

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

bool __thiscall QProcess::waitForReadyRead(QProcess *this,int msecs)

{
  char cVar1;
  int iVar2;
  QProcessPrivate *this_00;
  bool bVar3;
  long in_FS_OFFSET;
  undefined1 local_28 [24];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QProcessPrivate *)(this->super_QIODevice).super_QObject.d_ptr.d;
  if (this_00->processState != '\0') {
    iVar2 = (this_00->super_QIODevicePrivate).currentReadChannel;
    if (iVar2 == 1) {
      cVar1 = (this_00->stderrChannel).closed;
joined_r0x0041d24d:
      if (cVar1 != '\0') goto LAB_0041d28e;
    }
    else if (iVar2 == 0) {
      cVar1 = (this_00->stdoutChannel).closed;
      goto joined_r0x0041d24d;
    }
    local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QDeadlineTimer::QDeadlineTimer((QDeadlineTimer *)local_28,(long)msecs,CoarseTimer);
    if ((this_00->processState != '\x01') ||
       (bVar3 = QProcessPrivate::waitForStarted(this_00,(QDeadlineTimer *)local_28), bVar3)) {
      bVar3 = QProcessPrivate::waitForReadyRead(this_00,(QDeadlineTimer *)local_28);
      goto LAB_0041d290;
    }
  }
LAB_0041d28e:
  bVar3 = false;
LAB_0041d290:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcess::waitForReadyRead(int msecs)
{
    Q_D(QProcess);

    if (d->processState == QProcess::NotRunning)
        return false;
    if (d->currentReadChannel == QProcess::StandardOutput && d->stdoutChannel.closed)
        return false;
    if (d->currentReadChannel == QProcess::StandardError && d->stderrChannel.closed)
        return false;

    QDeadlineTimer deadline(msecs);
    if (d->processState == QProcess::Starting) {
        bool started = d->waitForStarted(deadline);
        if (!started)
            return false;
    }

    return d->waitForReadyRead(deadline);
}